

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void vocremfd(voccxdef *ctx,vocddef *what,objnum func,prpnum prop,runsdef *val,int err)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  short in_CX;
  short in_DX;
  short *in_RSI;
  long in_RDI;
  voccxdef *in_R8;
  undefined4 in_R9D;
  int slots;
  char *in_stack_ffffffffffffffc8;
  tiocxdef **val_00;
  errcxdef *in_stack_ffffffffffffffd0;
  short *__s2;
  short *local_10;
  
  local_10 = in_RSI;
  if (in_RSI == *(short **)(in_RDI + 0xef8)) {
    iVar3 = *(int *)(in_RDI + 0xf00);
  }
  else if (in_RSI == *(short **)(in_RDI + 0xf18)) {
    iVar3 = *(int *)(in_RDI + 0xf20);
  }
  else {
    if (in_RSI != *(short **)(in_RDI + 0xf08)) {
      errsigf(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    }
    iVar3 = *(int *)(in_RDI + 0xf10);
  }
  do {
    if (iVar3 == 0) {
      return;
    }
    if ((*local_10 == in_DX) && (local_10[0xc] == in_CX)) {
      if (in_R8 == (voccxdef *)0x0) {
LAB_0022b8a2:
        vocdusav(in_R8,(vocddef *)CONCAT44(in_R9D,iVar3));
        *local_10 = -1;
        return;
      }
      if (*(char *)&in_R8->voccxerr == (char)local_10[4]) {
        val_00 = &in_R8->voccxtio;
        __s2 = local_10 + 8;
        uVar1 = datsiz((dattyp)__s2,val_00);
        iVar2 = memcmp(val_00,__s2,(ulong)uVar1);
        if (iVar2 == 0) goto LAB_0022b8a2;
      }
    }
    local_10 = local_10 + 0x10;
    iVar3 = iVar3 + -1;
  } while( true );
}

Assistant:

void vocremfd(voccxdef *ctx, vocddef *what, objnum func, prpnum prop,
              runsdef *val, int err)
{
    int      slots;
    
    if (what == ctx->voccxdmn) slots = ctx->voccxdmc;
    else if (what == ctx->voccxalm) slots = ctx->voccxalc;
    else if (what == ctx->voccxfus) slots = ctx->voccxfuc;
    else errsig(ctx->voccxerr, ERR_BADREMF);
    
    /* find the slot with this same fuse/daemon/notifier, and remove it */
    for ( ; slots ; ++what, --slots)
    {
        if (what->vocdfn == func
            && what->vocdprp == prop
            && (!val || (val->runstyp == what->vocdarg.runstyp
                         && !memcmp(&val->runsv, &what->vocdarg.runsv,
                                    (size_t)datsiz(val->runstyp,
                                                   &val->runsv)))))
        {
            /* save an undo record for this slot before changing */
            vocdusav(ctx, what);

            what->vocdfn = MCMONINV;
            return;
        }
    }

/*    errsig(ctx->voccxerr, err); <<<harmless - don't signal it>>> */
}